

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_emit_x86.h
# Opt level: O0

void emit_gmrmi(ASMState *as,x86Group xg,Reg rb,int32_t i)

{
  MCode *pMVar1;
  int iVar2;
  int in_ECX;
  uint in_EDX;
  uint in_ESI;
  ASMState *in_RDI;
  x86Op xo;
  x86Op local_18;
  
  if (in_ECX == (char)(MCode)in_ECX) {
    pMVar1 = in_RDI->mcp;
    in_RDI->mcp = pMVar1 + -1;
    pMVar1[-1] = (MCode)in_ECX;
    iVar2 = (in_ESI & 0xff0000) * 0x100;
  }
  else {
    *(int *)(in_RDI->mcp + -4) = in_ECX;
    in_RDI->mcp = in_RDI->mcp + -4;
    iVar2 = (in_ESI & 0xff00) * 0x10000;
  }
  local_18 = iVar2 + 0xfe;
  emit_mrm(in_RDI,local_18,in_ESI & 7 | in_EDX & 0x80200,in_EDX & 0xfff7fdff);
  return;
}

Assistant:

static void emit_gmrmi(ASMState *as, x86Group xg, Reg rb, int32_t i)
{
  x86Op xo;
  if (checki8(i)) {
    emit_i8(as, i);
    xo = XG_TOXOi8(xg);
  } else {
    emit_i32(as, i);
    xo = XG_TOXOi(xg);
  }
  emit_mrm(as, xo, (Reg)(xg & 7) | (rb & REX_64), (rb & ~REX_64));
}